

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathBezierQuadraticCurveTo(ImDrawList *this,ImVec2 *p2,ImVec2 *p3,int num_segments)

{
  ImVec2 *pIVar1;
  ImVec2 local_3c;
  int local_34;
  float local_30;
  int i_step;
  float t_step;
  ImVec2 p1;
  int num_segments_local;
  ImVec2 *p3_local;
  ImVec2 *p2_local;
  ImDrawList *this_local;
  
  p1.x = (float)num_segments;
  unique0x100000c1 = p3;
  pIVar1 = ImVector<ImVec2>::back(&this->_Path);
  _i_step = *pIVar1;
  if (p1.x == 0.0) {
    PathBezierQuadraticCurveToCasteljau
              (&this->_Path,(float)i_step,t_step,p2->x,p2->y,stack0xffffffffffffffe0->x,
               stack0xffffffffffffffe0->y,this->_Data->CurveTessellationTol,0);
  }
  else {
    local_30 = 1.0 / (float)(int)p1.x;
    for (local_34 = 1; local_34 <= (int)p1.x; local_34 = local_34 + 1) {
      local_3c = ImBezierQuadraticCalc
                           ((ImVec2 *)&i_step,p2,stack0xffffffffffffffe0,local_30 * (float)local_34)
      ;
      ImVector<ImVec2>::push_back(&this->_Path,&local_3c);
    }
  }
  return;
}

Assistant:

void ImDrawList::PathBezierQuadraticCurveTo(const ImVec2& p2, const ImVec2& p3, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        PathBezierQuadraticCurveToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, _Data->CurveTessellationTol, 0);// Auto-tessellated
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
            _Path.push_back(ImBezierQuadraticCalc(p1, p2, p3, t_step * i_step));
    }
}